

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.h
# Opt level: O0

void __thiscall
Init::TextDocumentSyncOptions::TextDocumentSyncOptions
          (TextDocumentSyncOptions *this,TextDocumentSyncOptions *param_1)

{
  undefined3 uVar1;
  TextDocumentSyncKind TVar2;
  bool bVar3;
  TextDocumentSyncOptions *param_1_local;
  TextDocumentSyncOptions *this_local;
  
  Reflectable::Reflectable(&this->super_Reflectable,&param_1->super_Reflectable);
  (this->super_Reflectable)._vptr_Reflectable = (_func_int **)&PTR_reflect_002cd620;
  uVar1 = *(undefined3 *)&param_1->field_0x9;
  TVar2 = param_1->change;
  this->openClose = param_1->openClose;
  *(undefined3 *)&this->field_0x9 = uVar1;
  this->change = TVar2;
  bVar3 = param_1->willSaveWaitUntil;
  this->willSave = param_1->willSave;
  this->willSaveWaitUntil = bVar3;
  optional<Init::SaveOptions>::optional(&this->save,&param_1->save);
  return;
}

Assistant:

void reflect (StringWriter &writer) override {
            writer.StartObject();
            reflectBool(writer, "openClose", openClose);
            reflectInt(writer, "change", (int) change);
            reflectBool(writer, "willSave", willSave);
            reflectBool(writer, "willSaveWaitUntil", willSaveWaitUntil);
            reflectOptionalObject(writer, "save", save);
            writer.EndObject();
        }